

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void ppc_cpu_reset(CPUState *dev)

{
  CPUPPCState_conflict2 *env;
  uint uVar1;
  TranslationBlock *pTVar2;
  TranslationBlock *pTVar3;
  TranslationBlock *pTVar4;
  uint uVar5;
  int iVar6;
  TranslationBlock *pTVar7;
  long lVar8;
  ulong uVar9;
  TranslationBlock *pTVar10;
  TranslationBlock *pTVar11;
  
  (*(code *)dev[3].tb_jmp_cache[0xa5e])();
  uVar1 = *(uint *)(dev[3].tb_jmp_cache + 0x8d8);
  uVar9 = 0x9000000000000040;
  if ((uVar1 >> 0x10 & 1) == 0) {
    uVar9 = 0x1000000000000040;
  }
  pTVar10 = (TranslationBlock *)(uVar9 & (ulong)dev[3].tb_jmp_cache[0x8d7]);
  pTVar7 = dev[1].tb_jmp_cache[0x3a9];
  pTVar11 = (TranslationBlock *)((ulong)pTVar10 & 0x8000000000000040);
  if (((ulong)pTVar7 >> 0x3c & 1) != 0) {
    pTVar11 = pTVar10;
  }
  if (((ulong)pTVar7 & 0x30) != 0) {
    (*cpu_interrupt_handler)(dev,4);
    pTVar7 = dev[1].tb_jmp_cache[0x3a9];
    uVar1 = *(uint *)(dev[3].tb_jmp_cache + 0x8d8);
  }
  uVar5 = (uint)pTVar7;
  if ((uVar5 >> 0x1c & 1) != 0 && (uVar1 & 8) != 0) {
    (*cpu_interrupt_handler)(dev,4);
    uVar5 = (uint)dev[1].tb_jmp_cache[0x3a9];
  }
  if ((((ulong)dev[3].tb_jmp_cache[0x8da] & 4) != 0) && ((uVar5 & 0x20000) != 0)) {
    pTVar7 = dev[1].tb_jmp_cache[0x3ab];
    pTVar10 = dev[1].tb_jmp_cache[0x359];
    pTVar2 = dev[1].tb_jmp_cache[0x35a];
    pTVar3 = dev[1].tb_jmp_cache[0x35b];
    pTVar4 = dev[1].tb_jmp_cache[0x35c];
    dev[1].tb_jmp_cache[0x359] = dev[1].tb_jmp_cache[0x3aa];
    dev[1].tb_jmp_cache[0x35a] = pTVar7;
    dev[1].tb_jmp_cache[0x3aa] = pTVar10;
    dev[1].tb_jmp_cache[0x3ab] = pTVar2;
    pTVar7 = dev[1].tb_jmp_cache[0x3ad];
    dev[1].tb_jmp_cache[0x35b] = dev[1].tb_jmp_cache[0x3ac];
    dev[1].tb_jmp_cache[0x35c] = pTVar7;
    dev[1].tb_jmp_cache[0x3ac] = pTVar3;
    dev[1].tb_jmp_cache[0x3ad] = pTVar4;
  }
  env = (CPUPPCState_conflict2 *)(dev[1].tb_jmp_cache + 0x359);
  uVar9 = (ulong)pTVar11 >> 6 & 0xffffffff;
  if (uVar9 != ((uVar5 >> 6 & 1) != 0)) {
    dev[3].tb_jmp_cache[0x946] = (TranslationBlock *)(uVar9 * 0xfff00000);
  }
  dev[1].tb_jmp_cache[0x3a9] = pTVar11;
  hreg_compute_hflags(env);
  if (((*(byte *)((long)dev[1].tb_jmp_cache + 0x1d4a) & 4) != 0) &&
     (*(int *)((long)dev[3].tb_jmp_cache + 0x46ec) == 0)) {
    iVar6 = (*(code *)dev[3].tb_jmp_cache[0x94f])(env);
    if (iVar6 != 0) {
      dev->halted = 1;
    }
  }
  dev[1].tb_jmp_cache[0x3ae] =
       (TranslationBlock *)((ulong)dev[3].tb_jmp_cache[0x946] | (ulong)dev[3].tb_jmp_cache[0x949]);
  if (*(int *)(dev[3].tb_jmp_cache + 0x8d8) != 6) {
    ppc_tlb_invalidate_all_ppc64(env);
  }
  hreg_compute_hflags(env);
  dev[1].tb_jmp_cache[0x3a6] = (TranslationBlock *)0xffffffffffffffff;
  dev->exception_index = -1;
  dev[3].tb_jmp_cache[0x8dd] = (TranslationBlock *)0x0;
  ppc_irq_reset_ppc64((PowerPCCPU_conflict3 *)dev);
  *(undefined1 *)((long)dev[3].tb_jmp_cache + 0x468c) = 1;
  for (lVar8 = 0; lVar8 != 0x2000; lVar8 = lVar8 + 8) {
    if (dev[1].tb_jmp_cache[lVar8 + 0x8c2] != (TranslationBlock *)0x0) {
      *(TranslationBlock **)((long)dev[1].tb_jmp_cache + lVar8 + 0x25e0) =
           dev[1].tb_jmp_cache[lVar8 + 0x8c3];
    }
  }
  return;
}

Assistant:

static void ppc_cpu_reset(CPUState *dev)
{
    CPUState *s = CPU(dev);
    PowerPCCPU *cpu = POWERPC_CPU(s);
    PowerPCCPUClass *pcc = POWERPC_CPU_GET_CLASS(cpu);
    CPUPPCState *env = &cpu->env;
    target_ulong msr;
    int i;

    pcc->parent_reset(dev);

    msr = (target_ulong)0;
    msr |= (target_ulong)MSR_HVB;
    msr |= (target_ulong)0 << MSR_AP; /* TO BE CHECKED */
    msr |= (target_ulong)0 << MSR_SA; /* TO BE CHECKED */
    msr |= (target_ulong)1 << MSR_EP;
#if defined(DO_SINGLE_STEP) && 0
    /* Single step trace mode */
    msr |= (target_ulong)1 << MSR_SE;
    msr |= (target_ulong)1 << MSR_BE;
#endif

#if defined(TARGET_PPC64)
    if (env->mmu_model & POWERPC_MMU_64) {
        msr |= (1ULL << MSR_SF);
    }
#endif

    hreg_store_msr(env, msr, 1);

    env->nip = env->hreset_vector | env->excp_prefix;
    if (env->mmu_model != POWERPC_MMU_REAL) {
        ppc_tlb_invalidate_all(env);
    }

    hreg_compute_hflags(env);
#ifdef _MSC_VER
    env->reserve_addr = (target_ulong)(0ULL - 1ULL);
#else
    env->reserve_addr = (target_ulong)-1ULL;
#endif
    /* Be sure no exception or interrupt is pending */
    env->pending_interrupts = 0;
    s->exception_index = POWERPC_EXCP_NONE;
    env->error_code = 0;
    ppc_irq_reset(cpu);

    /* tininess for underflow is detected before rounding */
    set_float_detect_tininess(float_tininess_before_rounding,
                              &env->fp_status);

    for (i = 0; i < ARRAY_SIZE(env->spr_cb); i++) {
        ppc_spr_t *spr = &env->spr_cb[i];

        if (!spr->name) {
            continue;
        }
        env->spr[i] = spr->default_value;
    }
}